

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlquerymodel_p.h
# Opt level: O2

QString * QSqlQueryModelSql::orderBy(QString *__return_storage_ptr__,QString *s)

{
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> QStack_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((s->d).size == 0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&s->d);
      return __return_storage_ptr__;
    }
  }
  else {
    latin1 = orderBy();
    QString::QString((QString *)&QStack_38,latin1);
    concat(__return_storage_ptr__,(QString *)&QStack_38,s);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_38);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

inline const static QString orderBy(const QString &s) { return s.isEmpty() ? s : concat(orderBy(), s); }